

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Executor_X86.cpp
# Opt level: O3

void __thiscall ExecutorX86::~ExecutorX86(ExecutorX86 *this)

{
  uchar *puVar1;
  void *pvVar2;
  
  (*(code *)NULLC::dealloc)(this->execErrorBuffer);
  mprotect((void *)(((ulong)(this->vmState).callStackEnd & 0xfffffffffffff000) + 0x1000),0x1000,3);
  mprotect((void *)(((ulong)(this->vmState).dataStackEnd & 0xfffffffffffff000) + 0x1000),0x1000,3);
  mprotect((void *)(((ulong)(this->vmState).regFileArrayEnd & 0xfffffffffffff000) + 0x1000),0x1000,3
          );
  (*(code *)NULLC::dealloc)((this->vmState).dataStackBase);
  (*(code *)NULLC::dealloc)((this->vmState).callStackBase);
  (*(code *)NULLC::dealloc)((this->vmState).tempStackArrayBase);
  (*(code *)NULLC::dealloc)((this->vmState).regFileArrayBase);
  ClearNative(this);
  pvVar2 = (void *)(((ulong)(this->codeLaunchHeader + 0xfff) & 0xfffffffffffff000) - 0x1000);
  mprotect(pvVar2,((ulong)(this[1].codeLaunchHeader + 0xa97) & 0xfffffffffffff000) - (long)pvVar2,3)
  ;
  puVar1 = this->binCode;
  if (puVar1 != (uchar *)0x0) {
    pvVar2 = (void *)(((ulong)(puVar1 + 0xfff) & 0xfffffffffffff000) - 0x1000);
    mprotect(pvVar2,((ulong)(puVar1 + (ulong)this->binCodeSize + 0xfff) & 0xfffffffffffff000) -
                    (long)pvVar2,3);
  }
  (*(code *)NULLC::dealloc)(this->codeLaunchWin64UnwindTable);
  (*(code *)NULLC::dealloc)(this->binCode);
  NULLC::currExecutor = 0;
  x86ResetLabels();
  if ((this->breakInstructions).data != (Breakpoint *)0x0) {
    (*(code *)NULLC::dealloc)();
  }
  if ((this->functionWin64UnwindTable).data != (_RUNTIME_FUNCTION *)0x0) {
    (*(code *)NULLC::dealloc)();
  }
  if ((this->globalCodeRanges).data != (uint *)0x0) {
    (*(code *)NULLC::dealloc)();
  }
  if ((this->expiredFunctionAddressLists).data != (ExpiredFunctionAddressList *)0x0) {
    (*(code *)NULLC::dealloc)();
  }
  if ((this->functionAddress).data != (uchar **)0x0) {
    (*(code *)NULLC::dealloc)();
  }
  if ((this->instAddress).data != (uchar **)0x0) {
    (*(code *)NULLC::dealloc)();
  }
  FastVector<x86Instruction,_true,_true>::~FastVector(&this->instList);
  if ((this->expiredCodeBlocks).data != (ExpiredCodeBlock *)0x0) {
    (*(code *)NULLC::dealloc)();
  }
  if ((this->codeRegKillInfoOffsets).data != (uint *)0x0) {
    (*(code *)NULLC::dealloc)();
  }
  if ((this->codeJumpTargets).data != (uint *)0x0) {
    (*(code *)NULLC::dealloc)();
  }
  return;
}

Assistant:

ExecutorX86::~ExecutorX86()
{
	NULLC::dealloc(execErrorBuffer);

	NULLC::AllowMemoryPageRead(vmState.callStackEnd);
	NULLC::AllowMemoryPageRead(vmState.dataStackEnd);
	NULLC::AllowMemoryPageRead(vmState.regFileArrayEnd);

	NULLC::dealloc(vmState.dataStackBase);

	NULLC::dealloc(vmState.callStackBase);

	NULLC::dealloc(vmState.tempStackArrayBase);

	NULLC::dealloc(vmState.regFileArrayBase);

#if !defined(NULLC_NO_RAW_EXTERNAL_CALL)
	if(dcCallVM)
		dcFree(dcCallVM);
#endif

	ClearNative();

	// Disable execution of code head and code body
#ifndef __linux
	DWORD unusedProtect;
	VirtualProtect((void*)codeLaunchHeader, codeLaunchHeaderSize, oldCodeLaunchHeaderProtect, &unusedProtect);
	if(binCode)
		VirtualProtect((void*)binCode, binCodeSize, oldCodeBodyProtect, &unusedProtect);
#else
	NULLC::MemProtect((void*)codeLaunchHeader, codeLaunchHeaderSize, PROT_READ | PROT_WRITE);
	if(binCode)
		NULLC::MemProtect((void*)binCode, binCodeSize, PROT_READ | PROT_WRITE);
#endif

	NULLC::dealloc(codeLaunchWin64UnwindTable);

	NULLC::dealloc(binCode);

	NULLC::currExecutor = NULL;

	x86ResetLabels();
}